

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

void mtree_indent(mtree_writer *mtree)

{
  archive_string *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  char *__s;
  char *__s_00;
  uint uVar11;
  
  iVar3 = 0;
  if (mtree->classic == L'\0') {
    uVar11 = 0;
  }
  else if (mtree->indent == L'\0') {
    uVar11 = (uint)(mtree->depth != L'\0') << 2;
  }
  else {
    iVar3 = mtree->depth << 2;
    uVar11 = 0;
  }
  __s = (mtree->ebuf).s;
  pcVar9 = __s + -1;
  do {
    pcVar4 = pcVar9 + 1;
    pcVar9 = pcVar9 + 1;
  } while (*pcVar4 == ' ');
  pcVar4 = strchr(pcVar9,0x20);
  pcVar9 = (char *)0x0;
  if (pcVar4 != (char *)0x0) {
    paVar1 = &mtree->buf;
    iVar8 = iVar3 + 0xf;
    if (iVar3 + 0xf < 1) {
      iVar8 = 0;
    }
    bVar2 = false;
    pcVar5 = pcVar4;
    do {
      if (bVar2) {
        if (0x3e < (long)(pcVar5 + ((long)iVar3 - (long)__s))) {
          if (pcVar9 != (char *)0x0) {
            pcVar5 = pcVar9;
          }
          archive_strncat(paVar1,__s,(long)pcVar5 - (long)__s);
          archive_strncat(paVar1," \\\n",3);
          iVar7 = iVar8 + 1;
          if (-0x10 < iVar3) {
            do {
              archive_strappend_char(paVar1,' ');
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          goto LAB_0027c378;
        }
        __s_00 = pcVar5 + 1;
        pcVar9 = pcVar5;
      }
      else {
        iVar7 = iVar3 + uVar11;
        if (0 < (int)(iVar3 + uVar11)) {
          do {
            archive_strappend_char(paVar1,' ');
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        archive_strncat(paVar1,__s,(long)pcVar5 - (long)__s);
        lVar10 = ((long)pcVar5 - (long)__s) + (ulong)uVar11;
        if (lVar10 < 0x10) {
          if ((int)lVar10 < 0x10) {
            iVar7 = ((uVar11 - 1) + (int)pcVar5) - (int)__s;
            do {
              archive_strappend_char(paVar1,' ');
              iVar7 = iVar7 + 1;
            } while (iVar7 < 0xf);
          }
        }
        else {
          archive_strncat(paVar1," \\\n",3);
          iVar7 = iVar8 + 1;
          if (-0x10 < iVar3) {
            do {
              archive_strappend_char(paVar1,' ');
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
LAB_0027c378:
        __s = pcVar5 + 1;
        pcVar9 = (char *)0x0;
        __s_00 = __s;
      }
      pcVar5 = strchr(__s_00,0x20);
      bVar2 = true;
    } while (pcVar5 != (char *)0x0);
  }
  if (pcVar4 == (char *)0x0) {
    iVar8 = uVar11 + iVar3;
    if (iVar8 != 0 && SCARRY4(uVar11,iVar3) == iVar8 < 0) {
      do {
        archive_strappend_char(&mtree->buf,' ');
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    archive_strcat(&mtree->buf,__s);
    sVar6 = strlen(__s);
    __s = __s + sVar6;
  }
  if ((pcVar9 != (char *)0x0) && (sVar6 = strlen(__s), 0x3e < sVar6 + (long)iVar3)) {
    paVar1 = &mtree->buf;
    archive_strncat(paVar1,__s,(long)pcVar9 - (long)__s);
    archive_strncat(paVar1," \\\n",3);
    if (-0x10 < iVar3) {
      iVar8 = 0;
      if (0 < iVar3 + 0xf) {
        iVar8 = iVar3 + 0xf;
      }
      iVar8 = iVar8 + 1;
      do {
        archive_strappend_char(paVar1,' ');
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    __s = pcVar9 + 1;
  }
  archive_strcat(&mtree->buf,__s);
  (mtree->ebuf).length = 0;
  return;
}

Assistant:

static void
mtree_indent(struct mtree_writer *mtree)
{
	int i, fn, nd, pd;
	const char *r, *s, *x;

	if (mtree->classic) {
		if (mtree->indent) {
			nd = 0;
			pd = mtree->depth * 4;
		} else {
			nd = mtree->depth?4:0;
			pd = 0;
		}
	} else
		nd = pd = 0;
	fn = 1;
	s = r = mtree->ebuf.s;
	x = NULL;
	while (*r == ' ')
		r++;
	while ((r = strchr(r, ' ')) != NULL) {
		if (fn) {
			fn = 0;
			for (i = 0; i < nd + pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
			archive_strncat(&mtree->buf, s, r - s);
			if (nd + (r -s) > INDENTNAMELEN) {
				archive_strncat(&mtree->buf, " \\\n", 3);
				for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
					archive_strappend_char(&mtree->buf, ' ');
			} else {
				for (i = (int)(r -s + nd);
				    i < (INDENTNAMELEN + 1); i++)
					archive_strappend_char(&mtree->buf, ' ');
			}
			s = ++r;
			x = NULL;
			continue;
		}
		if (pd + (r - s) <= MAXLINELEN - 3 - INDENTNAMELEN)
			x = r++;
		else {
			if (x == NULL)
				x = r;
			archive_strncat(&mtree->buf, s, x - s);
			archive_strncat(&mtree->buf, " \\\n", 3);
			for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
				archive_strappend_char(&mtree->buf, ' ');
			s = r = ++x;
			x = NULL;
		}
	}
	if (fn) {
		for (i = 0; i < nd + pd; i++)
			archive_strappend_char(&mtree->buf, ' ');
		archive_strcat(&mtree->buf, s);
		s += strlen(s);
	}
	if (x != NULL && pd + strlen(s) > MAXLINELEN - 3 - INDENTNAMELEN) {
		/* Last keyword is longer. */
		archive_strncat(&mtree->buf, s, x - s);
		archive_strncat(&mtree->buf, " \\\n", 3);
		for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
			archive_strappend_char(&mtree->buf, ' ');
		s = ++x;
	}
	archive_strcat(&mtree->buf, s);
	archive_string_empty(&mtree->ebuf);
}